

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

int __thiscall
IDisk::FindEndOfWeakArea
          (IDisk *this,int side,int track,uint *current_search_revolution,uint *next_correct_index,
          uint nb_used_revolutions,int *rev_to_use,bool *revolution_wrecked)

{
  Revolution *pRVar1;
  uchar *puVar2;
  uchar *puVar3;
  uint i;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  Side *pSVar20;
  bool bVar21;
  uint local_17c;
  int inner_revolution_to_use;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  IDisk *local_110;
  ulong local_108;
  ulong local_100;
  uint ending_search [16];
  int tmp_buffer [16];
  uint inner_search_end [16];
  
  uVar16 = (ulong)nb_used_revolutions;
  local_130 = 0xffffffffffffffff;
  for (uVar10 = 0; iVar4 = (int)local_130, uVar16 != uVar10; uVar10 = uVar10 + 1) {
    if (revolution_wrecked[uVar10] == false) {
      ending_search[uVar10] = next_correct_index[uVar10];
      local_130 = local_130 & 0xffffffff;
      if (iVar4 == -1) {
        local_130 = uVar10 & 0xffffffff;
      }
    }
  }
  if (iVar4 != -1) {
    uVar9 = ending_search[iVar4];
    pSVar20 = this->side_ + side;
    local_130 = local_130 & 0xffffffff;
    uVar15 = 0;
    local_17c = 0;
    local_110 = this;
    while( true ) {
      uVar14 = current_search_revolution[iVar4];
      iVar5 = uVar9 - uVar14;
      if ((((iVar5 - 0xeU <= uVar15) || (uVar9 < uVar14 + 0xe)) ||
          (ending_search[iVar4] - uVar14 <= uVar15)) || (iVar5 - uVar15 <= local_17c)) break;
      uVar14 = uVar14 + uVar15;
      tmp_buffer[iVar4] = uVar14;
      for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
        if (local_130 != uVar10) {
          tmp_buffer[uVar10] = -1;
        }
      }
      local_108 = (ulong)(uVar15 + 0x40);
      local_100 = (ulong)uVar14;
      iVar5 = uVar15 - 0x40;
      if (uVar15 < 0x40) {
        iVar5 = 0;
      }
      for (uVar10 = 0; uVar10 != uVar16; uVar10 = uVar10 + 1) {
        if ((uVar10 != local_130) && (revolution_wrecked[uVar10] == false)) {
          uVar6 = (int)local_108 + current_search_revolution[uVar10];
          uVar13 = (ulong)(current_search_revolution[uVar10] + iVar5);
          uVar8 = ending_search[uVar10] - 0xf;
          if (uVar6 < ending_search[uVar10] - 0xf) {
            uVar8 = uVar6;
          }
          uVar18 = (ulong)uVar8;
          bVar21 = false;
          uVar19 = uVar13;
          local_128 = uVar18;
          local_120 = uVar10;
          while ((uVar19 < uVar18 && (!bVar21))) {
            pRVar1 = pSVar20->tracks[track].revolution;
            if ((uVar14 + 0xe < pRVar1[iVar4].size) && ((int)uVar13 + 0xeU < pRVar1[uVar10].size)) {
              puVar2 = pRVar1[iVar4].bitfield;
              puVar3 = pRVar1[uVar10].bitfield;
              local_118 = uVar13;
              iVar7 = bcmp(puVar2 + local_100,puVar3 + uVar19,0xe);
              uVar13 = local_118;
              uVar10 = local_120;
              uVar18 = local_128;
              if (iVar7 != 0) {
                bVar21 = true;
                for (uVar11 = 0; uVar11 < 0xe; uVar11 = uVar11 + 2) {
                  bVar21 = (bool)(bVar21 & puVar2[uVar14 + (int)uVar11] ==
                                           puVar3[(uint)((int)uVar19 + (int)uVar11)]);
                }
                if (!bVar21) {
                  bVar21 = false;
                  goto LAB_00172023;
                }
              }
              tmp_buffer[local_120] = (int)uVar19;
              bVar21 = true;
            }
            else {
              bVar21 = false;
            }
LAB_00172023:
            uVar13 = (ulong)((int)uVar13 + 1);
            uVar19 = uVar19 + 1;
          }
        }
      }
      bVar21 = true;
      for (uVar10 = 1; uVar10 < uVar16; uVar10 = uVar10 + 1) {
        if (revolution_wrecked[uVar10] == false) {
          bVar21 = (bool)(bVar21 & tmp_buffer[uVar10] != -1);
        }
      }
      if (bVar21) {
        uVar14 = 1;
        uVar8 = 0;
        uVar10 = 0xffffffffffffffff;
        for (uVar13 = 0; uVar13 != uVar16; uVar13 = uVar13 + 1) {
          for (uVar18 = (ulong)uVar14; uVar18 < uVar16; uVar18 = uVar18 + 1) {
            if ((revolution_wrecked[uVar13] == false) && (revolution_wrecked[uVar18] == false)) {
              uVar17 = next_correct_index[uVar13] - tmp_buffer[uVar13];
              uVar6 = next_correct_index[uVar18] - tmp_buffer[uVar18];
              if (uVar17 <= uVar6) {
                uVar6 = uVar17;
              }
              uVar17 = 0;
              bVar21 = true;
              while ((bVar21 && (uVar17 <= uVar6))) {
                pRVar1 = pSVar20->tracks[track].revolution;
                bVar21 = pRVar1[uVar13].bitfield[uVar17 + tmp_buffer[uVar13]] ==
                         pRVar1[uVar18].bitfield[uVar17 + tmp_buffer[uVar18]];
                if (bVar21) {
                  uVar17 = uVar17 + 2;
                }
              }
              if (uVar17 < uVar6) {
                uVar6 = uVar17;
              }
              bVar21 = uVar8 < uVar6;
              if (uVar8 <= uVar6) {
                uVar8 = uVar6;
              }
              if (bVar21) {
                uVar10 = uVar13;
              }
              uVar10 = uVar10 & 0xffffffff;
            }
          }
          uVar14 = uVar14 + 1;
        }
        if (local_17c < uVar8) {
          *rev_to_use = (int)uVar10;
          lVar12 = 8;
          for (uVar10 = 0; local_17c = uVar8, uVar16 != uVar10; uVar10 = uVar10 + 1) {
            if (revolution_wrecked[uVar10] == false) {
              ending_search[uVar10] = tmp_buffer[uVar10] + uVar8;
              uVar14 = *(uint *)((long)&(pSVar20->tracks[track].revolution)->bitfield + lVar12);
              if (uVar14 < tmp_buffer[uVar10] + uVar8) {
                if (nb_used_revolutions - 1 == uVar10) {
                  revolution_wrecked[uVar10] = true;
                }
                else {
                  ending_search[uVar10] = uVar14;
                }
              }
            }
            lVar12 = lVar12 + 0x30;
          }
        }
      }
      uVar15 = uVar15 + 1;
    }
    if (local_17c != 0) {
      for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
        if (revolution_wrecked[uVar10] == false) {
          next_correct_index[uVar10] = ending_search[uVar10];
        }
      }
      for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
        if (revolution_wrecked[uVar10] == false) {
          inner_search_end[uVar10] = ending_search[uVar10] - local_17c;
        }
      }
      inner_revolution_to_use = -1;
      uVar9 = FindEndOfWeakArea(local_110,side,track,current_search_revolution,inner_search_end,
                                nb_used_revolutions,&inner_revolution_to_use,revolution_wrecked);
      if (uVar9 == 0) {
        return local_17c;
      }
      for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
        if (revolution_wrecked[uVar10] == false) {
          next_correct_index[uVar10] = inner_search_end[uVar10];
        }
      }
      *rev_to_use = inner_revolution_to_use;
      return uVar9;
    }
  }
  return 0;
}

Assistant:

int IDisk::FindEndOfWeakArea(int side, int track, unsigned int* current_search_revolution, unsigned int* next_correct_index,
                             unsigned int nb_used_revolutions, int* rev_to_use, bool revolution_wrecked[16])
{
   // Init : The ending is, by default, pNextCorrectIndex
   unsigned int ending_search[16];
   unsigned int best_count = 0;
   int tmp_buffer[16];

   int refrev = -1;

   for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
   {
      if (!revolution_wrecked[rev])
      {
         ending_search[rev] = next_correct_index[rev];
         if (refrev == -1)
            refrev = rev;
      }
   }

   if (refrev == -1) return 0;

   // Rev0 is the reference.
   unsigned int maxRev0 = ending_search[refrev];

   for (unsigned int index = 0; index < maxRev0 - current_search_revolution[refrev] - RECOVER_SIZE
        && index < (ending_search[refrev] - current_search_revolution[refrev])
        && best_count < maxRev0 - current_search_revolution[refrev] - index
        && (maxRev0 >= (current_search_revolution[refrev] + RECOVER_SIZE)); index++)
   {
      tmp_buffer[refrev] = index + current_search_revolution[refrev];
      for (unsigned int i = 0; i < nb_used_revolutions; i++) { if (refrev != i) tmp_buffer[i] = -1; }
      for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
      {
         if (refrev != rev && !revolution_wrecked[rev])
         {
            // Walk every reference until we find something that is same (at least 14 bits correct)
            unsigned int min = (index < MOVING_AREA)
                                  ? (current_search_revolution[rev])
                                  : (current_search_revolution[rev] + index - MOVING_AREA);
            unsigned int max = current_search_revolution[rev] + index + MOVING_AREA;
            if (max > ending_search[rev] - RECOVER_SIZE - 1) max = ending_search[rev] - RECOVER_SIZE - 1;
            bool found = false;
            for (unsigned int i = min; i < max && !found; i++)
            {
               if (side_[side].tracks[track].revolution[refrev].size <= current_search_revolution[refrev] + index + RECOVER_SIZE
                  || side_[side].tracks[track].revolution[rev].size <= i + RECOVER_SIZE)
               {
                  found = false;
               }
               else
               {
                  if (memcmp(&side_[side].tracks[track].revolution[refrev].bitfield[current_search_revolution[refrev] + index],
                             &side_[side].tracks[track].revolution[rev].bitfield[i], RECOVER_SIZE) == 0)
                  {
                     tmp_buffer[rev] = i;
                     found = true;
                  }
                     // Half (one on 2) is the same - For all those dump with half datas (clock or data)
                  else
                  {
                     bool ok = true;
                     for (int i2 = 0; i2 < RECOVER_SIZE; i2 += 2)
                     {
                        if (side_[side].tracks[track].revolution[refrev].bitfield[current_search_revolution[refrev] + index + i2
                           ] != side_[side].tracks[track].revolution[rev].bitfield[i + i2]
                        )
                        {
                           ok = false;
                        }
                     }
                     if (ok)
                     {
                        tmp_buffer[rev] = i;
                        found = true;
                        // Only half is correct
                     }
                  }
               }
            }
         }
      }

      // All Tmp != 0 ?
      bool ok = true;
      for (unsigned int rev = 1; rev < nb_used_revolutions; rev++)
      {
         if (!revolution_wrecked[rev] && (tmp_buffer[rev] == -1))
         {
            ok = false;
         }
      }
      // Found ! Count how many bits are correct.
      if (ok)
      {
         unsigned int count = 0;
         int revolution_count = -1;
         int bit_corrects[16][16];
         for (unsigned int i = 0; i < nb_used_revolutions; i++)
         {
            for (unsigned int j = i + 1; j < nb_used_revolutions; j++)
            {
               if (!revolution_wrecked[i] && !revolution_wrecked[j])
               {
                  // Comparaison des revolutions i et j
                  bool revolution_comp_ok = true;
                  bit_corrects[i][j] = 0;
                  unsigned int localcount = 0;
                  // Max comp : pTmp -> pNextCorrectIndex
                  unsigned int max_comp_1 = next_correct_index[i] - tmp_buffer[i];
                  unsigned int max_comp_2 = next_correct_index[j] - tmp_buffer[j];
                  unsigned int min_comp = std::min(max_comp_1, max_comp_2);

                  while (revolution_comp_ok && localcount <= min_comp)
                  {
                     // Compare
                     if (side_[side].tracks[track].revolution[i].bitfield[tmp_buffer[i] + localcount] != side_[side].tracks[
                        track].revolution[j].bitfield[tmp_buffer[j] + localcount])
                     {
                        revolution_comp_ok = false;
                     }
                     else
                     {
                        localcount += 2;
                     }
                  }
                  if (localcount > min_comp) localcount = min_comp;
                  bit_corrects[i][j] = localcount;
                  if (count < localcount)
                  {
                     count = localcount;
                     revolution_count = i;
                  }
               }
            }
         }

         // Better than the previous one ?
         if (count > best_count)
         {
            // Yes : set it as the best candidate
            best_count = count;
            *rev_to_use = revolution_count;
            // In all case, set the end of the search to the end of this set
            for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
            {
               if (!revolution_wrecked[rev])
               {
                  ending_search[rev] = tmp_buffer[rev] + count;
                  if (ending_search[rev] > side_[side].tracks[track].revolution[rev].size)
                  {
                     if (rev == nb_used_revolutions - 1)
                        revolution_wrecked[rev] = true;
                     else
                        ending_search[rev] = side_[side].tracks[track].revolution[rev].size;
                  }
               }
            }
         }
      }
   }

   if (best_count > 0)
   {
      for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
      {
         if (!revolution_wrecked[rev])
            next_correct_index[rev] = ending_search[rev];
      }

      // Check recursively for inner area search, from initial current_search_revolution to pEndingSearch-bestCount
      unsigned int inner_search_end[16];
      for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
      {
         if (!revolution_wrecked[rev])
            inner_search_end[rev] = ending_search[rev] - best_count;
      }

      int inner_revolution_to_use = -1;
      int inner_best_count = FindEndOfWeakArea(side, track, current_search_revolution, inner_search_end, nb_used_revolutions,
                                             &inner_revolution_to_use, revolution_wrecked);
      if (inner_best_count != 0)
      {
         // Return these datas
         for (unsigned int rev = 0; rev < nb_used_revolutions; rev++)
         {
            if (!revolution_wrecked[rev])
               next_correct_index[rev] = inner_search_end[rev];
         }
         *rev_to_use = inner_revolution_to_use;

         return inner_best_count;
      }
      // Nothing found : Return our datas
      return best_count;
   }
   return best_count;
}